

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

statement * make_statement(dmr_C *C,expression *expr)

{
  statement *psVar1;
  
  if (expr != (expression *)0x0) {
    psVar1 = dmrC_alloc_statement(C,expr->pos,2);
    (psVar1->field_2).field_1.expression = expr;
    return psVar1;
  }
  return (statement *)0x0;
}

Assistant:

static struct statement *make_statement(struct dmr_C *C, struct expression *expr)
{
	struct statement *stmt;

	if (!expr)
		return NULL;
	stmt = dmrC_alloc_statement(C, expr->pos, STMT_EXPRESSION);
	stmt->expression = expr;
	return stmt;
}